

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

bool DeleteCoinsDBFromDisk(path *db_path,bool is_snapshot)

{
  long lVar1;
  pointer pcVar2;
  char cVar3;
  bool bVar4;
  undefined7 in_register_00000031;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  path local_88;
  string path_str;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((int)CONCAT71(in_register_00000031,is_snapshot) != 0) {
    std::filesystem::__cxx11::path::path(&local_88,&db_path->super_path);
    std::filesystem::__cxx11::path::operator/=(&local_88,(path *)&node::SNAPSHOT_BLOCKHASH_FILENAME)
    ;
    std::filesystem::__cxx11::path::path((path *)&path_str,&local_88);
    std::filesystem::__cxx11::path::~path(&local_88);
    cVar3 = std::filesystem::remove((path *)&path_str);
    if (cVar3 == '\0') {
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a8,node::SNAPSHOT_BLOCKHASH_FILENAME,
                 DAT_013d1d98 + node::SNAPSHOT_BLOCKHASH_FILENAME);
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
      ;
      source_file._M_len = 0x5e;
      logging_function._M_str = "DeleteCoinsDBFromDisk";
      logging_function._M_len = 0x15;
      LogPrintFormatInternal<std::__cxx11::string>
                (logging_function,source_file,0x15f8,ALL,Info,(ConstevalFormatString<1U>)0xfd8507,
                 &local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
    }
    std::filesystem::__cxx11::path::~path((path *)&path_str);
  }
  pcVar2 = (db_path->super_path)._M_pathname._M_dataplus._M_p;
  path_str._M_dataplus._M_p = (pointer)&path_str.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&path_str,pcVar2,pcVar2 + (db_path->super_path)._M_pathname._M_string_length)
  ;
  source_file_00._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
  ;
  source_file_00._M_len = 0x5e;
  logging_function_00._M_str = "DeleteCoinsDBFromDisk";
  logging_function_00._M_len = 0x15;
  LogPrintFormatInternal<std::__cxx11::string>
            (logging_function_00,source_file_00,0x1601,ALL,Info,(ConstevalFormatString<1U>)0xfd8570,
             &path_str);
  bVar4 = DestroyDB(&path_str);
  if (!bVar4) {
    source_file_01._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
    ;
    source_file_01._M_len = 0x5e;
    logging_function_01._M_str = "DeleteCoinsDBFromDisk";
    logging_function_01._M_len = 0x15;
    LogPrintFormatInternal<std::__cxx11::string>
              (logging_function_01,source_file_01,0x1608,ALL,Info,
               (ConstevalFormatString<1U>)0xfd858c,&path_str);
    if (!bVar4) {
      bVar4 = false;
      goto LAB_00b07cca;
    }
  }
  cVar3 = std::filesystem::status(&db_path->super_path);
  bVar4 = cVar3 == -1 || cVar3 == '\0';
LAB_00b07cca:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)path_str._M_dataplus._M_p != &path_str.field_2) {
    operator_delete(path_str._M_dataplus._M_p,path_str.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(::cs_main)
{
    AssertLockHeld(::cs_main);

    if (is_snapshot) {
        fs::path base_blockhash_path = db_path / node::SNAPSHOT_BLOCKHASH_FILENAME;

        try {
            bool existed = fs::remove(base_blockhash_path);
            if (!existed) {
                LogPrintf("[snapshot] snapshot chainstate dir being removed lacks %s file\n",
                          fs::PathToString(node::SNAPSHOT_BLOCKHASH_FILENAME));
            }
        } catch (const fs::filesystem_error& e) {
            LogPrintf("[snapshot] failed to remove file %s: %s\n",
                    fs::PathToString(base_blockhash_path), fsbridge::get_filesystem_error_message(e));
        }
    }

    std::string path_str = fs::PathToString(db_path);
    LogPrintf("Removing leveldb dir at %s\n", path_str);

    // We have to destruct before this call leveldb::DB in order to release the db
    // lock, otherwise `DestroyDB` will fail. See `leveldb::~DBImpl()`.
    const bool destroyed = DestroyDB(path_str);

    if (!destroyed) {
        LogPrintf("error: leveldb DestroyDB call failed on %s\n", path_str);
    }

    // Datadir should be removed from filesystem; otherwise initialization may detect
    // it on subsequent statups and get confused.
    //
    // If the base_blockhash_path removal above fails in the case of snapshot
    // chainstates, this will return false since leveldb won't remove a non-empty
    // directory.
    return destroyed && !fs::exists(db_path);
}